

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O0

int FIX::socket_setsockopt(socket_handle s,int opt,int optval)

{
  int iVar1;
  int local_18;
  int local_14;
  int level;
  int optval_local;
  int opt_local;
  socket_handle s_local;
  
  local_18 = 1;
  if (opt == 1) {
    local_18 = 6;
  }
  local_14 = optval;
  level = opt;
  optval_local = s;
  iVar1 = setsockopt(s,local_18,opt,&local_14,4);
  return iVar1;
}

Assistant:

int socket_setsockopt(socket_handle s, int opt, int optval) {
  int level = SOL_SOCKET;
  if (opt == TCP_NODELAY) {
    level = IPPROTO_TCP;
  }

#ifdef _MSC_VER
  return ::setsockopt(s, level, opt, (char *)&optval, sizeof(optval));
#else
  return ::setsockopt(s, level, opt, &optval, sizeof(optval));
#endif
}